

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

TimeZoneGenericNameMatchInfo * __thiscall
icu_63::TZGNCore::findLocal
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  StringEnumeration *pSVar4;
  undefined4 extraout_var;
  TimeZoneGenericNameMatchInfo *pTVar5;
  _func_int **pp_Var6;
  UnicodeString *size;
  UVector *pUVar7;
  GNameSearchHandler handler;
  
  handler.super_TextTrieMapSearchResultHandler._vptr_TextTrieMapSearchResultHandler =
       (_func_int **)&PTR_handleMatch_003a1f38;
  handler.fResults = (UVector *)0x0;
  handler.fMaxMatchLen = 0;
  handler.fTypes = types;
  umtx_lock_63((UMutex *)gLock);
  size = text;
  TextTrieMap::search(&this->fGNamesTrie,text,start,&handler.super_TextTrieMapSearchResultHandler,
                      status);
  umtx_unlock_63((UMutex *)gLock);
  iVar2 = handler.fMaxMatchLen;
  pUVar7 = handler.fResults;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    handler.fResults = (UVector *)0x0;
    handler.fMaxMatchLen = 0;
    if (pUVar7 == (UVector *)0x0) {
LAB_0020850b:
      umtx_lock_63((UMutex *)gLock);
      if (this->fGNamesTrieFullyLoaded == '\0') {
        pSVar4 = TimeZone::createTimeZoneIDEnumeration
                           (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          while( true ) {
            iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[7])(pSVar4,status);
            if (((UnicodeString *)CONCAT44(extraout_var,iVar3) == (UnicodeString *)0x0) ||
               (U_ZERO_ERROR < *status)) break;
            loadStrings(this,(UnicodeString *)CONCAT44(extraout_var,iVar3));
          }
        }
        else if (pSVar4 == (StringEnumeration *)0x0) goto LAB_0020857a;
        (*(pSVar4->super_UObject)._vptr_UObject[1])(pSVar4);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          this->fGNamesTrieFullyLoaded = '\x01';
        }
      }
LAB_0020857a:
      umtx_unlock_63((UMutex *)gLock);
      if (U_ZERO_ERROR < *status) goto LAB_00208624;
      umtx_lock_63((UMutex *)gLock);
      TextTrieMap::search(&this->fGNamesTrie,text,start,
                          &handler.super_TextTrieMapSearchResultHandler,status);
      umtx_unlock_63((UMutex *)gLock);
      iVar2 = handler.fMaxMatchLen;
      pUVar7 = handler.fResults;
      handler.fResults = (UVector *)0x0;
      handler.fMaxMatchLen = 0;
      pTVar5 = (TimeZoneGenericNameMatchInfo *)0x0;
      if ((pUVar7 == (UVector *)0x0) || (iVar2 < 1)) goto LAB_00208627;
      pTVar5 = (TimeZoneGenericNameMatchInfo *)UMemory::operator_new((UMemory *)0x8,(size_t)text);
      if (pTVar5 != (TimeZoneGenericNameMatchInfo *)0x0) {
        pTVar5->fMatches = pUVar7;
        goto LAB_00208627;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
      pp_Var6 = (pUVar7->super_UObject)._vptr_UObject;
    }
    else {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      if ((iVar2 != iVar3 - start) && (this->fGNamesTrieFullyLoaded == '\0')) {
        (*(pUVar7->super_UObject)._vptr_UObject[1])(pUVar7);
        goto LAB_0020850b;
      }
      pTVar5 = (TimeZoneGenericNameMatchInfo *)UMemory::operator_new((UMemory *)0x8,(size_t)size);
      if (pTVar5 != (TimeZoneGenericNameMatchInfo *)0x0) {
        pTVar5->fMatches = pUVar7;
        goto LAB_00208627;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
      pp_Var6 = (pUVar7->super_UObject)._vptr_UObject;
    }
    (*pp_Var6[1])(pUVar7);
  }
LAB_00208624:
  pTVar5 = (TimeZoneGenericNameMatchInfo *)0x0;
LAB_00208627:
  GNameSearchHandler::~GNameSearchHandler(&handler);
  return pTVar5;
}

Assistant:

TimeZoneGenericNameMatchInfo*
TZGNCore::findLocal(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    GNameSearchHandler handler(types);

    TZGNCore *nonConstThis = const_cast<TZGNCore *>(this);

    umtx_lock(&gLock);
    {
        fGNamesTrie.search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    }
    umtx_unlock(&gLock);

    if (U_FAILURE(status)) {
        return NULL;
    }

    TimeZoneGenericNameMatchInfo *gmatchInfo = NULL;

    int32_t maxLen = 0;
    UVector *results = handler.getMatches(maxLen);
    if (results != NULL && ((maxLen == (text.length() - start)) || fGNamesTrieFullyLoaded)) {
        // perfect match
        gmatchInfo = new TimeZoneGenericNameMatchInfo(results);
        if (gmatchInfo == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete results;
            return NULL;
        }
        return gmatchInfo;
    }

    if (results != NULL) {
        delete results;
    }

    // All names are not yet loaded into the local trie.
    // Load all available names into the trie. This could be very heavy.
    umtx_lock(&gLock);
    {
        if (!fGNamesTrieFullyLoaded) {
            StringEnumeration *tzIDs = TimeZone::createTimeZoneIDEnumeration(UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
            if (U_SUCCESS(status)) {
                const UnicodeString *tzID;
                while ((tzID = tzIDs->snext(status)) != NULL) {
                    if (U_FAILURE(status)) {
                        break;
                    }
                    nonConstThis->loadStrings(*tzID);
                }
            }
            if (tzIDs != NULL) {
                delete tzIDs;
            }

            if (U_SUCCESS(status)) {
                nonConstThis->fGNamesTrieFullyLoaded = TRUE;
            }
        }
    }
    umtx_unlock(&gLock);

    if (U_FAILURE(status)) {
        return NULL;
    }

    umtx_lock(&gLock);
    {
        // now try it again
        fGNamesTrie.search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    }
    umtx_unlock(&gLock);

    results = handler.getMatches(maxLen);
    if (results != NULL && maxLen > 0) {
        gmatchInfo = new TimeZoneGenericNameMatchInfo(results);
        if (gmatchInfo == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete results;
            return NULL;
        }
    }

    return gmatchInfo;
}